

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBinPacker.cxx
# Opt level: O3

bool __thiscall
cmCTestBinPackerAllocation::operator==
          (cmCTestBinPackerAllocation *this,cmCTestBinPackerAllocation *other)

{
  size_t __n;
  int iVar1;
  
  if (((this->ProcessIndex == other->ProcessIndex) && (this->SlotsNeeded == other->SlotsNeeded)) &&
     (__n = (this->Id)._M_string_length, __n == (other->Id)._M_string_length)) {
    if (__n != 0) {
      iVar1 = bcmp((this->Id)._M_dataplus._M_p,(other->Id)._M_dataplus._M_p,__n);
      return iVar1 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool cmCTestBinPackerAllocation::operator==(
  const cmCTestBinPackerAllocation& other) const
{
  return this->ProcessIndex == other.ProcessIndex &&
    this->SlotsNeeded == other.SlotsNeeded && this->Id == other.Id;
}